

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::multipredict<false,false>
               (gd *g,base_learner *param_2,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  double dVar1;
  vw *all;
  vw *pvVar2;
  polyprediction *ppVar3;
  size_t sVar4;
  bool bVar5;
  float fVar6;
  multipredict_info<sparse_parameters> local_48;
  
  all = g->all;
  ppVar3 = pred;
  sVar4 = count;
  while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
    ppVar3->scalar = (ec->l).simple.initial;
    ppVar3 = ppVar3 + 1;
  }
  pvVar2 = g->all;
  local_48.count = count;
  local_48.step = step;
  local_48.pred = pred;
  if ((pvVar2->weights).sparse == false) {
    local_48.weights = (sparse_parameters *)&(pvVar2->weights).dense_weights;
    local_48.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_48);
  }
  else {
    local_48.weights = &(pvVar2->weights).sparse_weights;
    local_48.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_48);
  }
  dVar1 = all->sd->contraction;
  ppVar3 = pred;
  sVar4 = count;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    while (sVar4 != 0) {
      ppVar3->scalar = (float)all->sd->contraction * ppVar3->scalar;
      ppVar3 = ppVar3 + 1;
      sVar4 = sVar4 - 1;
    }
  }
  if (finalize_predictions) {
    while (bVar5 = count != 0, count = count - 1, bVar5) {
      fVar6 = finalize_prediction(all->sd,pred->scalar);
      pred->scalar = fVar6;
      pred = pred + 1;
    }
  }
  return;
}

Assistant:

void multipredict(
    gd& g, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *g.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (g.all->weights.sparse)
  {
    multipredict_info<sparse_parameters> mp = {
        count, step, pred, g.all->weights.sparse_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    multipredict_info<dense_parameters> mp = {count, step, pred, g.all->weights.dense_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}